

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::ebml_read_header(MatroskaDemuxer *this,char **doctype,int *version)

{
  ostream *poVar1;
  VodCoreException *pVVar2;
  int64_t local_6f0;
  int64_t num_3;
  char *text;
  string local_6d8;
  ostringstream local_6b8 [8];
  ostringstream ss_3;
  long local_540;
  int64_t num_2;
  string local_530;
  ostringstream local_510 [8];
  ostringstream ss_2;
  long local_398;
  int64_t num_1;
  string local_388;
  ostringstream local_368 [8];
  ostringstream ss_1;
  long local_1f0;
  int64_t num;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream ss;
  int local_34;
  int local_30;
  int res;
  int levelUp;
  uint32_t id;
  int *version_local;
  char **doctype_local;
  MatroskaDemuxer *this_local;
  
  if (doctype != (char **)0x0) {
    *doctype = (char *)0x0;
  }
  if (version != (int *)0x0) {
    *version = 1;
  }
  _levelUp = version;
  version_local = (int *)doctype;
  doctype_local = (char **)this;
  res = ebml_peek_id(this,&local_30);
  if (((res == 0) || (local_30 != 0)) || (res != 0x1a45dfa3)) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar1 = std::operator<<((ostream *)local_1b0,"This is not an EBML file (id=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,res);
    poVar1 = std::operator<<(poVar1,"/");
    std::ostream::operator<<(poVar1,0x1a45dfa3);
    num._7_1_ = 1;
    pVVar2 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar2,900,&local_1e0);
    num._7_1_ = 0;
    __cxa_throw(pVVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  local_34 = ebml_read_master(this,(uint32_t *)&res);
  if (local_34 < 0) {
    return local_34;
  }
LAB_002c523f:
  do {
    while( true ) {
      if (local_34 != 0) {
        return 0;
      }
      res = ebml_peek_id(this,&local_30);
      if (res == 0) {
        return -1;
      }
      if (local_30 != 0) {
        return 0;
      }
      if ((res != 0xbf) && (res != 0xec)) break;
LAB_002c583a:
      local_34 = ebml_read_skip(this);
    }
    if (res != 0x4282) {
      if (res == 0x4285) {
        local_34 = ebml_read_uint(this,(uint32_t *)&res,&local_6f0);
        if (local_34 < 0) {
          return local_34;
        }
        if (_levelUp != (int *)0x0) {
          *_levelUp = (int)local_6f0;
        }
      }
      else {
        if (res - 0x4286U < 2) goto LAB_002c583a;
        if (res == 0x42f2) {
          local_34 = ebml_read_uint(this,(uint32_t *)&res,&local_540);
          if (local_34 < 0) {
            return local_34;
          }
          if (8 < local_540) {
            std::__cxx11::ostringstream::ostringstream(local_6b8);
            poVar1 = std::operator<<((ostream *)local_6b8,"IDs of size ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_540);
            std::operator<<(poVar1," (> 8) not supported");
            text._7_1_ = 1;
            pVVar2 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(pVVar2,900,&local_6d8);
            text._7_1_ = 0;
            __cxa_throw(pVVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        else if (res == 0x42f3) {
          local_34 = ebml_read_uint(this,(uint32_t *)&res,&local_398);
          if (local_34 < 0) {
            return local_34;
          }
          if (8 < local_398) {
            std::__cxx11::ostringstream::ostringstream(local_510);
            poVar1 = std::operator<<((ostream *)local_510,"Integers of size ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_398);
            std::operator<<(poVar1," (> 8) not supported");
            num_2._7_1_ = 1;
            pVVar2 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(pVVar2,900,&local_530);
            num_2._7_1_ = 0;
            __cxa_throw(pVVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        else if (res == 0x42f7) {
          local_34 = ebml_read_uint(this,(uint32_t *)&res,&local_1f0);
          if (local_34 < 0) {
            return local_34;
          }
          if (1 < local_1f0) {
            std::__cxx11::ostringstream::ostringstream(local_368);
            poVar1 = std::operator<<((ostream *)local_368,"EBML version ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1f0);
            poVar1 = std::operator<<(poVar1," > ");
            poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
            std::operator<<(poVar1," is not supported");
            num_1._7_1_ = 1;
            pVVar2 = (VodCoreException *)__cxa_allocate_exception(0x28);
            std::__cxx11::ostringstream::str();
            VodCoreException::VodCoreException(pVVar2,900,&local_388);
            num_1._7_1_ = 0;
            __cxa_throw(pVVar2,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        else {
          local_34 = ebml_read_skip(this);
        }
      }
      goto LAB_002c523f;
    }
    local_34 = ebml_read_ascii(this,(uint32_t *)&res,(char **)&num_3);
    if (local_34 < 0) {
      return local_34;
    }
    if (version_local != (int *)0x0) {
      *(int64_t *)version_local = num_3;
    }
  } while( true );
}

Assistant:

int MatroskaDemuxer::ebml_read_header(char **doctype, int *version)
{
    uint32_t id;
    int levelUp, res = 0;

    /* default init */
    if (doctype)
        *doctype = nullptr;
    if (version)
        *version = 1;

    if ((id = ebml_peek_id(&levelUp)) == 0 || levelUp != 0 || id != EBML_ID_HEADER)
    {
        THROW(ERR_MATROSKA_PARSE, "This is not an EBML file (id=" << id << "/" << EBML_ID_HEADER)
    }
    if ((res = ebml_read_master(&id)) < 0)
        return res;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&levelUp)) == 0)
            return -BufferedReader::DATA_EOF;

        /* end-of-header */
        if (levelUp)
            break;

        switch (id)
        {
        /* is our read version uptodate? */
        case EBML_ID_EBMLREADVERSION:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > EBML_VERSION)
            {
                THROW(ERR_MATROSKA_PARSE, "EBML version " << num << " > " << EBML_VERSION << " is not supported")
            }
            break;
        }

        /* we only handle 8 byte lengths at max */
        case EBML_ID_EBMLMAXSIZELENGTH:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > 8)
            {
                THROW(ERR_MATROSKA_PARSE, "Integers of size " << num << " (> 8) not supported")
            }
            break;
        }

        /* we handle 4 byte IDs at max */
        case EBML_ID_EBMLMAXIDLENGTH:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > 8)
            {
                THROW(ERR_MATROSKA_PARSE, "IDs of size " << num << " (> 8) not supported")
            }
            break;
        }

        case EBML_ID_DOCTYPE:
        {
            char *text;

            if ((res = ebml_read_ascii(&id, &text)) < 0)
                return res;
            if (doctype)
            {
                *doctype = text;
            }
            break;
        }

        case EBML_ID_DOCTYPEREADVERSION:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (version)
                *version = static_cast<int>(num);
            break;
        }
        /* we ignore these four, as they don't tell us anything we care about */
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
        case EBML_ID_EBMLVERSION:
        case EBML_ID_DOCTYPEVERSION:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown data type " << id << " in EBML header");
        }
    }

    return 0;
}